

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O2

void SwapUVRow_SSSE3(uint8_t *src_uv,uint8_t *dst_vu,int width)

{
  undefined1 (*pauVar1) [16];
  bool bVar2;
  uvec8 auVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar3 = libyuv::kShuffleUVToVU;
  do {
    auVar5 = *(undefined1 (*) [16])src_uv;
    pauVar1 = (undefined1 (*) [16])((long)src_uv + 0x10);
    src_uv = (uint8_t *)((long)src_uv + 0x20);
    auVar5 = pshufb(auVar5,(undefined1  [16])auVar3);
    auVar6 = pshufb(*pauVar1,(undefined1  [16])auVar3);
    *(undefined1 (*) [16])dst_vu = auVar5;
    *(undefined1 (*) [16])((long)dst_vu + 0x10) = auVar6;
    dst_vu = (uint8_t *)((long)dst_vu + 0x20);
    iVar4 = width + -0x10;
    bVar2 = 0xf < width;
    width = iVar4;
  } while (iVar4 != 0 && bVar2);
  return;
}

Assistant:

void SwapUVRow_SSSE3(const uint8_t* src_uv, uint8_t* dst_vu, int width) {
  asm volatile(

      "movdqu      %3,%%xmm5                     \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "pshufb      %%xmm5,%%xmm0                 \n"
      "pshufb      %%xmm5,%%xmm1                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "movdqu      %%xmm1,0x10(%1)               \n"
      "lea         0x20(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      : "+r"(src_uv),        // %0
        "+r"(dst_vu),        // %1
        "+r"(width)          // %2
      : "m"(kShuffleUVToVU)  // %3
      : "memory", "cc", "xmm0", "xmm1", "xmm5");
}